

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  operator_delete(this->ownAllocator_,1);
  Stack<rapidjson::CrtAllocator>::Destroy(&this->ranges_);
  Stack<rapidjson::CrtAllocator>::Destroy(&this->states_);
  return;
}

Assistant:

~GenericRegex()
    {
        RAPIDJSON_DELETE(ownAllocator_);
    }